

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O3

OPJ_BOOL bmp_read_rle4_data(FILE *IN,OPJ_UINT8 *pData,OPJ_UINT32 stride,OPJ_UINT32 width,
                           OPJ_UINT32 height)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  OPJ_BOOL OVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  long lVar14;
  int iVar15;
  
  if (height == 0) {
    iVar15 = 0;
  }
  else {
    pbVar12 = pData + height * stride;
    uVar9 = 0;
    uVar11 = 0;
    iVar15 = 0;
    pbVar13 = pData;
    do {
      iVar2 = getc((FILE *)IN);
      if (iVar2 == 0) {
        uVar3 = getc((FILE *)IN);
        switch(uVar3) {
        case 0:
          uVar11 = uVar11 + 1;
          pbVar13 = pData + uVar11 * stride;
          uVar9 = 0;
          break;
        case 1:
          goto LAB_0010d5b5;
        case 2:
          iVar2 = getc((FILE *)IN);
          if ((iVar2 == -1) || (iVar5 = getc((FILE *)IN), iVar5 == -1))
          goto switchD_0010d45b_caseD_ffffffff;
          uVar9 = iVar2 + uVar9;
          uVar11 = uVar11 + iVar5;
          pbVar13 = pData + (ulong)(uVar11 * stride) + (ulong)uVar9;
          break;
        case 0xffffffff:
          goto switchD_0010d45b_caseD_ffffffff;
        default:
          if (((0 < (int)uVar3) && (uVar9 < width)) && (pbVar13 < pbVar12)) {
            lVar14 = 1;
            uVar8 = 0;
            uVar7 = 0;
            do {
              if ((uVar8 & 1) == 0) {
                uVar4 = getc((FILE *)IN);
                uVar7 = (ulong)uVar4;
                if (uVar4 == 0xffffffff) goto switchD_0010d45b_caseD_ffffffff;
              }
              bVar10 = (byte)uVar7;
              if ((uVar8 & 1) == 0) {
                bVar10 = (byte)(uVar7 >> 4);
              }
              pbVar13[uVar8] = bVar10 & 0xf;
              uVar8 = uVar8 + 1;
            } while ((((int)lVar14 < (int)uVar3) && (uVar9 + (int)lVar14 < width)) &&
                    (pbVar1 = pbVar13 + lVar14, lVar14 = lVar14 + 1, pbVar1 < pbVar12));
            uVar9 = uVar9 + (int)uVar8;
            iVar15 = iVar15 + (int)uVar8;
            pbVar13 = pbVar13 + uVar8;
          }
          if (((uVar3 & 3) - 1 < 2) && (iVar2 = getc((FILE *)IN), iVar2 == -1))
          goto switchD_0010d45b_caseD_ffffffff;
        }
      }
      else {
        if ((iVar2 == -1) || (uVar3 = getc((FILE *)IN), uVar3 == 0xffffffff))
        goto switchD_0010d45b_caseD_ffffffff;
        if ((0 < iVar2) && ((uVar9 < width && (pbVar13 < pbVar12)))) {
          iVar5 = 1;
          bVar10 = 0;
          do {
            *pbVar13 = (byte)(uVar3 >> (~bVar10 & 4)) & 0xf;
            iVar15 = iVar15 + 1;
            uVar9 = uVar9 + 1;
            pbVar13 = pbVar13 + 1;
            if ((iVar2 <= iVar5) || (width <= uVar9)) break;
            iVar5 = iVar5 + 1;
            bVar10 = bVar10 + 4;
          } while (pbVar13 < pbVar12);
        }
      }
    } while (uVar11 < height);
  }
LAB_0010d5b5:
  OVar6 = 1;
  if (iVar15 != height * width) {
    bmp_read_rle4_data_cold_1();
switchD_0010d45b_caseD_ffffffff:
    OVar6 = 0;
  }
  return OVar6;
}

Assistant:

static OPJ_BOOL bmp_read_rle4_data(FILE* IN, OPJ_UINT8* pData,
                                   OPJ_UINT32 stride, OPJ_UINT32 width, OPJ_UINT32 height)
{
    OPJ_UINT32 x, y, written;
    OPJ_UINT8 *pix;
    const OPJ_UINT8 *beyond;

    beyond = pData + stride * height;
    pix = pData;
    x = y = written = 0U;
    while (y < height) {
        int c = getc(IN);
        if (c == EOF) {
            return OPJ_FALSE;
        }

        if (c) { /* encoded mode */
            int j, c1_int;
            OPJ_UINT8 c1;

            c1_int = getc(IN);
            if (c1_int == EOF) {
                return OPJ_FALSE;
            }
            c1 = (OPJ_UINT8)c1_int;

            for (j = 0; (j < c) && (x < width) &&
                    ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
                written++;
            }
        } else { /* absolute mode */
            c = getc(IN);
            if (c == EOF) {
                return OPJ_FALSE;
            }

            if (c == 0x00) { /* EOL */
                x = 0;
                y++;
                pix = pData + y * stride;
            } else if (c == 0x01) { /* EOP */
                break;
            } else if (c == 0x02) { /* MOVE by dxdy */
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                x += (OPJ_UINT32)c;
                c = getc(IN);
                if (c == EOF) {
                    return OPJ_FALSE;
                }
                y += (OPJ_UINT32)c;
                pix = pData + y * stride + x;
            } else { /* 03 .. 255 : absolute mode */
                int j;
                OPJ_UINT8 c1 = 0U;

                for (j = 0; (j < c) && (x < width) &&
                        ((OPJ_SIZE_T)pix < (OPJ_SIZE_T)beyond); j++, x++, pix++) {
                    if ((j & 1) == 0) {
                        int c1_int;
                        c1_int = getc(IN);
                        if (c1_int == EOF) {
                            return OPJ_FALSE;
                        }
                        c1 = (OPJ_UINT8)c1_int;
                    }
                    *pix = (OPJ_UINT8)((j & 1) ? (c1 & 0x0fU) : ((c1 >> 4) & 0x0fU));
                    written++;
                }
                if (((c & 3) == 1) || ((c & 3) == 2)) { /* skip padding byte */
                    c = getc(IN);
                    if (c == EOF) {
                        return OPJ_FALSE;
                    }
                }
            }
        }
    }  /* while(y < height) */
    if (written != width * height) {
        fprintf(stderr, "warning, image's actual size does not match advertized one\n");
        return OPJ_FALSE;
    }
    return OPJ_TRUE;
}